

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_line_profile_aa.cpp
# Opt level: O1

void __thiscall
agg::line_profile_aa::set(line_profile_aa *this,double center_width,double smoother_width)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  line_profile_aa *__s;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  dVar10 = (double)(~-(ulong)(center_width == 0.0) & (ulong)center_width |
                   -(ulong)(center_width == 0.0) & 0x3f70000000000000);
  dVar9 = (double)(~-(ulong)(smoother_width == 0.0) & (ulong)smoother_width |
                  -(ulong)(smoother_width == 0.0) & 0x3f70000000000000);
  dVar11 = dVar10 + dVar9;
  dVar12 = *(double *)(this + 0x118);
  dVar8 = dVar11 / dVar12;
  if (dVar11 < dVar12) {
    dVar10 = dVar10 / dVar8;
    dVar9 = dVar9 / dVar8;
  }
  iVar5 = (int)(long)((dVar10 + dVar9) * 256.0 + 0.5);
  *(int *)(this + 0x110) = iVar5;
  uVar6 = iVar5 + 0x600;
  if (*(uint *)(this + 8) < uVar6) {
    pod_array<unsigned_char>::resize((pod_array<unsigned_char> *)this,uVar6);
  }
  dVar12 = (double)(~-(ulong)(dVar11 < dVar12) & 0x3ff0000000000000 |
                   (ulong)dVar8 & -(ulong)(dVar11 < dVar12));
  lVar1 = *(long *)this;
  uVar7 = (ulong)(dVar9 * 256.0);
  iVar5 = (int)(long)(dVar10 * 256.0);
  uVar2 = (long)(dVar10 * 256.0) & 0xffffffff;
  if (iVar5 != 0) {
    memset((void *)(lVar1 + 0x200),(uint)(byte)this[((long)(dVar12 * 255.0) & 0xffffffffU) + 0x10],
           uVar2);
  }
  __s = (line_profile_aa *)(lVar1 + uVar2 + 0x200);
  if ((int)uVar7 != 0) {
    dVar10 = 0.0;
    uVar2 = uVar7 & 0xffffffff;
    do {
      *__s = this[((long)(((dVar10 / (double)(uVar7 & 0xffffffff)) * -dVar12 + dVar12) * 255.0) &
                  0xffffffffU) + 0x10];
      __s = __s + 1;
      dVar10 = dVar10 + 1.0;
      uVar6 = (int)uVar2 - 1;
      uVar2 = (ulong)uVar6;
    } while (uVar6 != 0);
  }
  iVar5 = *(int *)(this + 8) - (iVar5 + (int)uVar7);
  if (iVar5 != 0x200) {
    memset(__s,*(int *)(this + 0x10),(ulong)(iVar5 - 0x201) + 1);
  }
  lVar3 = 0x200;
  lVar4 = 0x1ff;
  do {
    *(undefined1 *)(lVar1 + lVar4) = *(undefined1 *)(lVar1 + lVar3);
    lVar3 = lVar3 + 1;
    lVar4 = lVar4 + -1;
  } while ((int)lVar3 != 0x400);
  return;
}

Assistant:

void line_profile_aa::set(double center_width, double smoother_width)
    {
        double base_val = 1.0;
        if(center_width == 0.0)   center_width = 1.0 / subpixel_scale;
        if(smoother_width == 0.0) smoother_width = 1.0 / subpixel_scale;

        double width = center_width + smoother_width;
        if(width < m_min_width)
        {
            double k = width / m_min_width;
            base_val *= k;
            center_width /= k;
            smoother_width /= k;
        }

        value_type* ch = profile(center_width + smoother_width);

        unsigned subpixel_center_width = unsigned(center_width * subpixel_scale);
        unsigned subpixel_smoother_width = unsigned(smoother_width * subpixel_scale);

        value_type* ch_center   = ch + subpixel_scale*2;
        value_type* ch_smoother = ch_center + subpixel_center_width;

        unsigned i;

        unsigned val = m_gamma[unsigned(base_val * aa_mask)];
        ch = ch_center;
        for(i = 0; i < subpixel_center_width; i++)
        {
            *ch++ = (value_type)val;
        }

        for(i = 0; i < subpixel_smoother_width; i++)
        {
            *ch_smoother++ = 
                m_gamma[unsigned((base_val - 
                                  base_val * 
                                  (double(i) / subpixel_smoother_width)) * aa_mask)];
        }

        unsigned n_smoother = profile_size() - 
                              subpixel_smoother_width - 
                              subpixel_center_width - 
                              subpixel_scale*2;

        val = m_gamma[0];
        for(i = 0; i < n_smoother; i++)
        {
            *ch_smoother++ = (value_type)val;
        }

        ch = ch_center;
        for(i = 0; i < subpixel_scale*2; i++)
        {
            *--ch = *ch_center++;
        }
    }